

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::SetLoopBodyEntryPoint
          (FunctionBody *this,LoopHeader *loopHeader,EntryPointInfo *entryPointInfo,
          JavascriptMethod entryPoint,uint loopNum)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  LoopEntryPointInfo *pLVar7;
  undefined4 extraout_var_00;
  
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,JITLoopBodyPhase);
  if (bVar2) {
    DumpFunctionId(this,true);
    iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    Output::Print(L": %-20s LoopBody EntryPt  Loop: %2d Address : %x\n",CONCAT44(extraout_var,iVar3)
                  ,(ulong)loopNum,entryPoint);
    Output::Flush();
  }
  if ((LoopHeader *)
      entryPointInfo[1].super_ProxyEntryPointInfo.super_ExpirableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject != loopHeader) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xfb0,
                                "(((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader)",
                                "((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader");
    if (!bVar2) goto LAB_007670a2;
    *puVar6 = 0;
  }
  if ((entryPointInfo->super_ProxyEntryPointInfo).jsMethod != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xfb1,
                                "(reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr)",
                                "reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr");
    if (!bVar2) {
LAB_007670a2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  (entryPointInfo->super_ProxyEntryPointInfo).jsMethod = (Type)entryPoint;
  uVar4 = ((DAT_015b0950 + 1U & 0xff) - 1) * (uint)DAT_015b0958;
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  *(uint *)((long)&entryPointInfo[1].super_ProxyEntryPointInfo.super_ExpirableObject.
                   registrationHandle + 4) = uVar4;
  pLVar7 = LoopHeader::GetCurrentEntryPointInfo(loopHeader);
  if (((pLVar7->super_EntryPointInfo).field_0x18 & 8) != 0) {
    iVar3 = (*(entryPointInfo->super_ProxyEntryPointInfo).super_ExpirableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb]
            )(entryPointInfo);
    uVar5 = GetLoopInterpretCount((FunctionBody *)CONCAT44(extraout_var_00,iVar3),loopHeader);
    loopHeader->interpretCount = uVar5 - 1;
  }
  VTuneChakraProfile::LogLoopBodyLoadEvent
            (this,(LoopEntryPointInfo *)entryPointInfo,(uint16)loopNum);
  return;
}

Assistant:

void FunctionBody::SetLoopBodyEntryPoint(Js::LoopHeader * loopHeader, EntryPointInfo* entryPointInfo, Js::JavascriptMethod entryPoint, uint loopNum)
    {
#if DBG_DUMP
        if (PHASE_TRACE1(Js::JITLoopBodyPhase))
        {
            DumpFunctionId(true);
            Output::Print(_u(": %-20s LoopBody EntryPt  Loop: %2d Address : %x\n"), GetDisplayName(), loopNum, entryPoint);
            Output::Flush();
        }
#endif
        Assert(((LoopEntryPointInfo*)entryPointInfo)->loopHeader == loopHeader);
        Assert(reinterpret_cast<void*>(entryPointInfo->jsMethod) == nullptr);
        entryPointInfo->jsMethod = entryPoint;

        ((Js::LoopEntryPointInfo*)entryPointInfo)->totalJittedLoopIterations =
            static_cast<uint8>(
                min(
                    static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejitForLoops))) *
                    (Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() - 1),
                    0xffu));

        // reset the counter to 1 less than the threshold for TJLoopBody
        if (loopHeader->GetCurrentEntryPointInfo()->GetIsAsmJSFunction())
        {
            loopHeader->interpretCount = entryPointInfo->GetFunctionBody()->GetLoopInterpretCount(loopHeader) - 1;
        }
        JS_ETW(EtwTrace::LogLoopBodyLoadEvent(this, ((LoopEntryPointInfo*)entryPointInfo), ((uint16)loopNum)));
#ifdef VTUNE_PROFILING
        VTuneChakraProfile::LogLoopBodyLoadEvent(this, ((LoopEntryPointInfo*)entryPointInfo), ((uint16)loopNum));
#endif
    }